

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inference.cc
# Opt level: O0

int __thiscall
xLearn::Predictor::sign
          (Predictor *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t *siglen,uchar *tbs,size_t tbslen)

{
  float fVar1;
  size_type sVar2;
  size_type sVar3;
  ostream *poVar4;
  ostream *poVar5;
  reference pvVar6;
  size_t i;
  allocator *function;
  int line;
  string *in_stack_ffffffffffffff78;
  ulong uVar7;
  ulong __n;
  LogSeverity in_stack_ffffffffffffff84;
  string local_78 [55];
  allocator local_41;
  string local_40 [36];
  Logger local_1c;
  vector<float,_std::allocator<float>_> *local_18;
  EVP_PKEY_CTX *local_10;
  Predictor *local_8;
  
  local_18 = (vector<float,_std::allocator<float>_> *)sig;
  local_10 = ctx;
  local_8 = this;
  sVar2 = std::vector<float,_std::allocator<float>_>::size
                    ((vector<float,_std::allocator<float>_> *)ctx);
  sVar3 = std::vector<float,_std::allocator<float>_>::size(local_18);
  if (sVar2 != sVar3) {
    Logger::Logger(&local_1c,ERR);
    line = (int)(sVar2 >> 0x20);
    function = &local_41;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/inference.cc"
               ,function);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"sign",(allocator *)&stack0xffffffffffffff87);
    poVar4 = Logger::Start(in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,line,
                           (string *)function);
    poVar4 = std::operator<<(poVar4,"CHECK_EQ failed ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/inference.cc"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x50);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"in.size()");
    poVar4 = std::operator<<(poVar4," = ");
    sVar2 = std::vector<float,_std::allocator<float>_>::size
                      ((vector<float,_std::allocator<float>_> *)local_10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar2);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"out.size()");
    poVar4 = std::operator<<(poVar4," = ");
    sVar2 = std::vector<float,_std::allocator<float>_>::size(local_18);
    poVar5 = (ostream *)std::ostream::operator<<(poVar4,sVar2);
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    Logger::~Logger((Logger *)poVar4);
    abort();
  }
  uVar7 = 0;
  while (__n = uVar7,
        sVar2 = std::vector<float,_std::allocator<float>_>::size
                          ((vector<float,_std::allocator<float>_> *)local_10), uVar7 < sVar2) {
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_10,__n);
    fVar1 = *pvVar6;
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](local_18,__n);
    *pvVar6 = (float)(0.0 < fVar1);
    uVar7 = __n + 1;
  }
  return (int)uVar7;
}

Assistant:

void Predictor::sign(std::vector<real_t>& in, 
                     std::vector<real_t>& out) {
  CHECK_EQ(in.size(), out.size());
  for (size_t i = 0; i < in.size(); ++i) {
    out[i] = in[i] > 0 ? 1 : 0;
  }
}